

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall wasm::AfterEffectFunctionChecker::check(AfterEffectFunctionChecker *this)

{
  Function *func;
  size_t sVar1;
  Fatal local_198;
  
  func = this->func;
  if ((func->super_Importable).super_Named.name.super_IString.str._M_str !=
      (this->name).super_IString.str._M_str) {
    __assert_fail("func->name == name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x372,"void wasm::AfterEffectFunctionChecker::check()");
  }
  if ((this->beganWithStackIR == true) &&
     ((func->stackIR)._M_t.
      super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
      .
      super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
      ._M_head_impl != (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0)) {
    sVar1 = FunctionHasher::hashFunction(func);
    if (sVar1 != this->originalFunctionHash) {
      Fatal::Fatal(&local_198);
      Fatal::operator<<(&local_198,
                        (char (*) [196])
                        "[PassRunner] PASS_DEBUG check failed: had Stack IR before and after the pass ran, and the pass modified the main IR, which invalidates Stack IR - pass should have been marked \'modifiesBinaryenIR\'"
                       );
      Fatal::~Fatal(&local_198);
    }
  }
  return;
}

Assistant:

void check() {
    assert(func->name == name); // no global module changes should have occurred
    if (beganWithStackIR && func->stackIR) {
      auto after = FunctionHasher::hashFunction(func);
      if (after != originalFunctionHash) {
        Fatal() << "[PassRunner] PASS_DEBUG check failed: had Stack IR before "
                   "and after the pass ran, and the pass modified the main IR, "
                   "which invalidates Stack IR - pass should have been marked "
                   "'modifiesBinaryenIR'";
      }
    }
  }